

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_io.c
# Opt level: O0

int KINGetWorkSpace(void *kinmem,long *lenrw,long *leniw)

{
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  KINMem kin_mem;
  int local_4;
  
  if (in_RDI == 0) {
    KINProcessError((KINMem)0x0,-1,0x38a,"KINGetWorkSpace",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_io.c"
                    ,"kinsol_mem = NULL illegal.");
    local_4 = -1;
  }
  else {
    *in_RSI = *(undefined8 *)(in_RDI + 0x210);
    *in_RDX = *(undefined8 *)(in_RDI + 0x218);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int KINGetWorkSpace(void* kinmem, long int* lenrw, long int* leniw)
{
  KINMem kin_mem;

  if (kinmem == NULL)
  {
    KINProcessError(NULL, KIN_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (KIN_MEM_NULL);
  }

  kin_mem = (KINMem)kinmem;

  *lenrw = kin_mem->kin_lrw;
  *leniw = kin_mem->kin_liw;

  return (KIN_SUCCESS);
}